

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O2

void __thiscall
QOpenGL2PaintEngineExPrivate::drawPixmapFragments
          (QOpenGL2PaintEngineExPrivate *this,PixmapFragment *fragments,int fragmentCount,
          QPixmap *pixmap,PixmapFragmentHints hints)

{
  QOpenGL2PEXVertexArray *this_00;
  QOpenGL2PEXVertexArray *this_01;
  long lVar1;
  qreal qVar2;
  qreal qVar3;
  PixelSrcType type;
  char cVar4;
  byte bVar5;
  bool bVar6;
  int iVar7;
  GLuint GVar8;
  int extraout_var;
  ulong uVar9;
  QOpenGLShaderProgram *pQVar10;
  long lVar11;
  QDataBuffer<float> *this_02;
  long lVar12;
  byte bVar13;
  long in_FS_OFFSET;
  undefined4 uVar14;
  undefined4 uVar15;
  double dVar16;
  double dVar17;
  float x;
  float y;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  float fVar22;
  undefined4 uVar23;
  float fVar24;
  undefined4 uVar25;
  undefined1 auVar26 [16];
  QColor QVar27;
  byte local_b8;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar7 = QPixmap::size();
  QPixmap::size();
  this_00 = &this->vertexCoordinateArray;
  QOpenGL2PEXVertexArray::clear(this_00);
  this_01 = &this->textureCoordinateArray;
  QOpenGL2PEXVertexArray::clear(this_01);
  (this->opacityArray).siz = 0;
  if (this->snapToPixelGrid == true) {
    this->snapToPixelGrid = false;
    this->matrixDirty = true;
  }
  this_02 = &this->opacityArray;
  lVar12 = 0;
  uVar9 = 0;
  if (0 < fragmentCount) {
    uVar9 = (ulong)(uint)fragmentCount;
  }
  bVar13 = 1;
  for (; uVar9 * 0x50 != lVar12; lVar12 = lVar12 + 0x50) {
    dVar16 = *(double *)((long)&fragments->rotation + lVar12);
    uVar23 = 0;
    uVar25 = 0;
    uVar14 = 0;
    uVar15 = 0x3ff00000;
    if ((dVar16 != 0.0) || (NAN(dVar16))) {
      qVar2 = qFastSin(dVar16 * 0.017453292519943295);
      qVar3 = qFastCos(*(double *)((long)&fragments->rotation + lVar12) * 0.017453292519943295);
      uVar14 = SUB84(qVar3,0);
      uVar15 = (undefined4)((ulong)qVar3 >> 0x20);
      uVar23 = SUB84(qVar2,0);
      uVar25 = (undefined4)((ulong)qVar2 >> 0x20);
    }
    dVar16 = *(double *)((long)&fragments->scaleX + lVar12) * 0.5 *
             *(double *)((long)&fragments->width + lVar12);
    dVar18 = *(double *)((long)&fragments->scaleY + lVar12) * 0.5 *
             *(double *)((long)&fragments->height + lVar12);
    dVar20 = -dVar18 * (double)CONCAT44(uVar25,uVar23);
    dVar21 = dVar16 * (double)CONCAT44(uVar15,uVar14);
    fVar22 = (float)(dVar21 + dVar20);
    dVar18 = dVar18 * (double)CONCAT44(uVar15,uVar14);
    dVar16 = dVar16 * (double)CONCAT44(uVar25,uVar23);
    fVar24 = (float)(dVar16 + dVar18);
    dVar17 = (double)fVar22;
    dVar19 = (double)fVar24;
    QOpenGL2PEXVertexArray::addVertex
              (this_00,(float)(*(double *)((long)&fragments->x + lVar12) + dVar17),
               (float)(*(double *)((long)&fragments->y + lVar12) + dVar19));
    dVar20 = (double)(float)(dVar20 - dVar21);
    dVar16 = (double)(float)(dVar18 - dVar16);
    QOpenGL2PEXVertexArray::addVertex
              (this_00,(float)(*(double *)((long)&fragments->x + lVar12) - dVar20),
               (float)(*(double *)((long)&fragments->y + lVar12) - dVar16));
    dVar18 = (double)-fVar22;
    dVar21 = (double)-fVar24;
    QOpenGL2PEXVertexArray::addVertex
              (this_00,(float)(*(double *)((long)&fragments->x + lVar12) + dVar18),
               (float)(*(double *)((long)&fragments->y + lVar12) + dVar21));
    QOpenGL2PEXVertexArray::addVertex
              (this_00,(float)(dVar18 + *(double *)((long)&fragments->x + lVar12)),
               (float)(dVar21 + *(double *)((long)&fragments->y + lVar12)));
    QOpenGL2PEXVertexArray::addVertex
              (this_00,(float)(dVar20 + *(double *)((long)&fragments->x + lVar12)),
               (float)(dVar16 + *(double *)((long)&fragments->y + lVar12)));
    QOpenGL2PEXVertexArray::addVertex
              (this_00,(float)(dVar17 + *(double *)((long)&fragments->x + lVar12)),
               (float)(dVar19 + *(double *)((long)&fragments->y + lVar12)));
    dVar16 = *(double *)((long)&fragments->sourceLeft + lVar12);
    dVar17 = *(double *)((long)&fragments->sourceTop + lVar12);
    x = (float)(dVar16 * (double)(1.0 / (float)iVar7));
    y = (float)(dVar17 * (double)(1.0 / (float)extraout_var));
    fVar22 = (float)((dVar16 + *(double *)((long)&fragments->width + lVar12)) *
                    (double)(1.0 / (float)iVar7));
    fVar24 = (float)((dVar17 + *(double *)((long)&fragments->height + lVar12)) *
                    (double)(1.0 / (float)extraout_var));
    QOpenGL2PEXVertexArray::addVertex(this_01,fVar22,fVar24);
    QOpenGL2PEXVertexArray::addVertex(this_01,fVar22,y);
    QOpenGL2PEXVertexArray::addVertex(this_01,x,y);
    QOpenGL2PEXVertexArray::addVertex(this_01,x,y);
    QOpenGL2PEXVertexArray::addVertex(this_01,x,fVar24);
    QOpenGL2PEXVertexArray::addVertex(this_01,fVar22,fVar24);
    lVar1 = *(long *)&this->q->field_0x8;
    lVar11 = lVar1 + -8;
    if (lVar1 == 0) {
      lVar11 = 0;
    }
    dVar16 = *(double *)((long)&fragments->opacity + lVar12) * *(double *)(lVar11 + 0x198);
    fVar22 = (float)dVar16;
    local_48._0_4_ = fVar22;
    QDataBuffer<float>::add(this_02,(float *)local_48);
    local_4c = fVar22;
    QDataBuffer<float>::add(this_02,&local_4c);
    local_50 = fVar22;
    QDataBuffer<float>::add(this_02,&local_50);
    local_54 = fVar22;
    QDataBuffer<float>::add(this_02,&local_54);
    local_58 = fVar22;
    QDataBuffer<float>::add(this_02,&local_58);
    local_5c = fVar22;
    QDataBuffer<float>::add(this_02,&local_5c);
    bVar13 = bVar13 & 0.9900000095367432 <= dVar16;
  }
  transferMode(this,ImageOpacityArrayDrawingMode);
  bVar6 = false;
  uploadData(this,0,&((this->vertexCoordinateArray).vertexArray.buffer)->x,
             (int)(this->vertexCoordinateArray).vertexArray.siz * 2);
  uploadData(this,1,&((this->textureCoordinateArray).vertexArray.buffer)->x,
             (int)(this->textureCoordinateArray).vertexArray.siz * 2);
  uploadData(this,2,(this->opacityArray).buffer,(GLuint)(this->opacityArray).siz);
  lVar11 = *(long *)&this->q->field_0x8;
  lVar12 = lVar11 + -8;
  if (lVar11 == 0) {
    lVar12 = 0;
  }
  updateTexture<QPixmap>
            (this,0,pixmap,0x812f,0x2601 - ((*(uint *)(lVar12 + 0x6c) & 4) == 0),UpdateIfNeeded);
  cVar4 = QPixmap::isQBitmap();
  if (cVar4 == '\0') {
    bVar5 = QPixmap::hasAlpha();
    local_b8 = (byte)hints.super_QFlagsStorageHelper<QPainter::PixmapFragmentHint,_4>.
                     super_QFlagsStorage<QPainter::PixmapFragmentHint>.i;
    bVar6 = (bool)((bVar5 ^ 1 | local_b8) & bVar13);
    type = ImageSrc;
  }
  else {
    type = PatternSrc;
  }
  QBrush::operator=(&this->currentBrush,&this->noBrush);
  QOpenGLEngineShaderManager::setSrcPixelType
            ((QOpenGLEngineShaderManager *)this->shaderManager,type);
  bVar6 = prepareForDraw(this,bVar6);
  if (bVar6) {
    pQVar10 = QOpenGLEngineShaderManager::currentProgram
                        ((QOpenGLEngineShaderManager *)this->shaderManager);
    GVar8 = location(this,ImageTexture);
    QOpenGLShaderProgram::setUniformValue(pQVar10,GVar8,0);
  }
  if (cVar4 != '\0') {
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    auVar26 = QPen::color();
    lVar11 = *(long *)&this->q->field_0x8;
    lVar12 = lVar11 + -8;
    if (lVar11 == 0) {
      lVar12 = 0;
    }
    QVar27._8_8_ = auVar26._8_8_ & 0xffffffffffff;
    QVar27._0_8_ = auVar26._0_8_;
    QVar27 = qt_premultiplyColor(QVar27,(float)*(double *)(lVar12 + 0x198));
    local_48._0_8_ = QVar27._0_8_;
    local_48._8_6_ = QVar27.ct._4_6_;
    pQVar10 = QOpenGLEngineShaderManager::currentProgram
                        ((QOpenGLEngineShaderManager *)this->shaderManager);
    GVar8 = location(this,PatternColor);
    QOpenGLShaderProgram::setUniformValue(pQVar10,GVar8,(QColor *)local_48);
  }
  (**(code **)(*(long *)&this->funcs + 0x78))(4,0,fragmentCount * 6);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGL2PaintEngineExPrivate::drawPixmapFragments(const QPainter::PixmapFragment *fragments,
                                                   int fragmentCount, const QPixmap &pixmap,
                                                   QPainter::PixmapFragmentHints hints)
{
    GLfloat dx = 1.0f / pixmap.size().width();
    GLfloat dy = 1.0f / pixmap.size().height();

    vertexCoordinateArray.clear();
    textureCoordinateArray.clear();
    opacityArray.reset();

    if (snapToPixelGrid) {
        snapToPixelGrid = false;
        matrixDirty = true;
    }

    bool allOpaque = true;

    for (int i = 0; i < fragmentCount; ++i) {
        qreal s = 0;
        qreal c = 1;
        if (fragments[i].rotation != 0) {
            s = qFastSin(qDegreesToRadians(fragments[i].rotation));
            c = qFastCos(qDegreesToRadians(fragments[i].rotation));
        }

        qreal right = 0.5 * fragments[i].scaleX * fragments[i].width;
        qreal bottom = 0.5 * fragments[i].scaleY * fragments[i].height;
        QOpenGLPoint bottomRight(right * c - bottom * s, right * s + bottom * c);
        QOpenGLPoint bottomLeft(-right * c - bottom * s, -right * s + bottom * c);

        vertexCoordinateArray.addVertex(bottomRight.x + fragments[i].x, bottomRight.y + fragments[i].y);
        vertexCoordinateArray.addVertex(-bottomLeft.x + fragments[i].x, -bottomLeft.y + fragments[i].y);
        vertexCoordinateArray.addVertex(-bottomRight.x + fragments[i].x, -bottomRight.y + fragments[i].y);
        vertexCoordinateArray.addVertex(-bottomRight.x + fragments[i].x, -bottomRight.y + fragments[i].y);
        vertexCoordinateArray.addVertex(bottomLeft.x + fragments[i].x, bottomLeft.y + fragments[i].y);
        vertexCoordinateArray.addVertex(bottomRight.x + fragments[i].x, bottomRight.y + fragments[i].y);

        QOpenGLRect src(fragments[i].sourceLeft * dx, fragments[i].sourceTop * dy,
                    (fragments[i].sourceLeft + fragments[i].width) * dx,
                    (fragments[i].sourceTop + fragments[i].height) * dy);

        textureCoordinateArray.addVertex(src.right, src.bottom);
        textureCoordinateArray.addVertex(src.right, src.top);
        textureCoordinateArray.addVertex(src.left, src.top);
        textureCoordinateArray.addVertex(src.left, src.top);
        textureCoordinateArray.addVertex(src.left, src.bottom);
        textureCoordinateArray.addVertex(src.right, src.bottom);

        qreal opacity = fragments[i].opacity * q->state()->opacity;
        opacityArray << opacity << opacity << opacity << opacity << opacity << opacity;
        allOpaque &= (opacity >= 0.99f);
    }

    transferMode(ImageOpacityArrayDrawingMode);

    uploadData(QT_VERTEX_COORDS_ATTR, (GLfloat*)vertexCoordinateArray.data(), vertexCoordinateArray.vertexCount() * 2);
    uploadData(QT_TEXTURE_COORDS_ATTR, (GLfloat*)textureCoordinateArray.data(), textureCoordinateArray.vertexCount() * 2);
    uploadData(QT_OPACITY_ATTR, (GLfloat*)opacityArray.data(), opacityArray.size());

    GLenum filterMode = q->state()->renderHints & QPainter::SmoothPixmapTransform ? GL_LINEAR : GL_NEAREST;
    updateTexture(QT_IMAGE_TEXTURE_UNIT, pixmap, GL_CLAMP_TO_EDGE, filterMode);

    bool isBitmap = pixmap.isQBitmap();
    bool isOpaque = !isBitmap && (!pixmap.hasAlpha() || (hints & QPainter::OpaqueHint)) && allOpaque;

    // Setup for texture drawing
    currentBrush = noBrush;
    shaderManager->setSrcPixelType(isBitmap ? QOpenGLEngineShaderManager::PatternSrc
                                            : QOpenGLEngineShaderManager::ImageSrc);
    if (prepareForDraw(isOpaque))
        shaderManager->currentProgram()->setUniformValue(location(QOpenGLEngineShaderManager::ImageTexture), QT_IMAGE_TEXTURE_UNIT);

    if (isBitmap) {
        QColor col = qt_premultiplyColor(q->state()->pen.color(), (GLfloat)q->state()->opacity);
        shaderManager->currentProgram()->setUniformValue(location(QOpenGLEngineShaderManager::PatternColor), col);
    }

    funcs.glDrawArrays(GL_TRIANGLES, 0, 6 * fragmentCount);
}